

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int on_ack_stream_ack_one
              (quicly_conn_t *conn,quicly_stream_id_t stream_id,quicly_sendstate_sent_t *sent)

{
  int iVar1;
  quicly_stream_t *state;
  st_quicly_conn_t *in_RDX;
  undefined8 in_RSI;
  quicly_stream_t *in_RDI;
  quicly_conn_t *_conn;
  size_t bytes_to_shift;
  int ret;
  quicly_stream_t *stream;
  quicly_stream_t *in_stack_ffffffffffffffb8;
  quicly_conn_t *in_stack_ffffffffffffffc0;
  quicly_conn_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int err;
  int local_4;
  
  err = (int)((ulong)in_RSI >> 0x20);
  state = quicly_get_stream(in_stack_ffffffffffffffc8,(quicly_stream_id_t)in_stack_ffffffffffffffc0)
  ;
  if (state == (quicly_stream_t *)0x0) {
    local_4 = 0;
  }
  else {
    local_4 = quicly_sendstate_acked
                        ((quicly_sendstate_t *)state,
                         (quicly_sendstate_sent_t *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         (size_t *)in_stack_ffffffffffffffc8);
    if (local_4 == 0) {
      if (in_stack_ffffffffffffffc8 != (quicly_conn_t *)0x0) {
        in_stack_ffffffffffffffc0 = state->conn;
        if ((quicly_trace_fp != (FILE *)0x0) &&
           (iVar1 = ptls_skip_tracing((in_stack_ffffffffffffffc0->crypto).tls), iVar1 == 0)) {
          QUICLY_STREAM_ON_SEND_SHIFT
                    (in_RDX,(int64_t)state,
                     (st_quicly_stream_t *)CONCAT44(local_4,in_stack_ffffffffffffffd0),
                     (size_t)in_stack_ffffffffffffffc8);
        }
        (*state->callbacks->on_send_shift)(state,(size_t)in_stack_ffffffffffffffc8);
      }
      iVar1 = stream_is_destroyable(in_stack_ffffffffffffffb8);
      if (iVar1 == 0) {
        if ((state->_send_aux).reset_stream.sender_state == QUICLY_SENDER_STATE_NONE) {
          resched_stream_data((quicly_stream_t *)in_stack_ffffffffffffffc0);
        }
      }
      else {
        destroy_stream(in_RDI,err);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int on_ack_stream_ack_one(quicly_conn_t *conn, quicly_stream_id_t stream_id, quicly_sendstate_sent_t *sent)
{
    quicly_stream_t *stream;
    int ret;

    if ((stream = quicly_get_stream(conn, stream_id)) == NULL)
        return 0;

    size_t bytes_to_shift;
    if ((ret = quicly_sendstate_acked(&stream->sendstate, sent, &bytes_to_shift)) != 0)
        return ret;
    if (bytes_to_shift != 0) {
        QUICLY_PROBE(STREAM_ON_SEND_SHIFT, stream->conn, stream->conn->stash.now, stream, bytes_to_shift);
        stream->callbacks->on_send_shift(stream, bytes_to_shift);
    }
    if (stream_is_destroyable(stream)) {
        destroy_stream(stream, 0);
    } else if (stream->_send_aux.reset_stream.sender_state == QUICLY_SENDER_STATE_NONE) {
        resched_stream_data(stream);
    }

    return 0;
}